

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::SymlinkCommand::configureAttribute
          (SymlinkCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ConfigureContext *pCVar1;
  size_t sVar2;
  bool bVar3;
  bool local_421;
  Twine local_408;
  Twine local_3f0;
  Twine local_3d8;
  Twine local_3c0;
  Twine local_3a8;
  Twine local_390;
  char *local_378 [2];
  SymlinkCommand *local_368;
  char *local_360;
  char *local_358 [2];
  SymlinkCommand *local_348;
  char *local_340;
  char *local_338 [2];
  void *local_328;
  size_t local_320;
  string local_318;
  char *local_2f8 [2];
  void *local_2e8;
  size_t local_2e0;
  string local_2d8;
  char *local_2b8 [2];
  char *local_2a8;
  size_t local_2a0;
  ConfigureContext *local_298;
  ConfigureContext *ctx_local;
  SymlinkCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  SymlinkCommand *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  SymlinkCommand *local_210;
  char *local_208;
  char *local_200;
  size_t local_1f8;
  char *local_1f0;
  size_t local_1e8;
  void *local_1e0;
  size_t local_1d8;
  char *local_1d0;
  size_t local_1c8;
  char *local_1c0;
  size_t local_1b8;
  void *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  size_t local_198;
  char *local_190;
  size_t local_188;
  char *local_180;
  size_t local_178;
  char **local_170;
  char *local_168;
  size_t local_160;
  void **local_158;
  char *local_150;
  size_t local_148;
  void **local_140;
  char *local_138;
  size_t local_130;
  SymlinkCommand **local_128;
  char *local_120;
  char *local_118;
  SymlinkCommand **local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  SymlinkCommand *local_e8;
  int local_dc;
  char *local_d8;
  char *local_d0;
  SymlinkCommand *local_c8;
  int local_bc;
  size_t local_b8;
  char *local_b0;
  void *local_a8;
  int local_9c;
  size_t local_98;
  char *local_90;
  void *local_88;
  int local_7c;
  size_t local_78;
  char *local_70;
  char *local_68;
  int local_5c;
  char *local_58;
  char **local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (SymlinkCommand *)value.Data;
  sVar2 = name.Length;
  local_2a8 = name.Data;
  local_50 = local_2b8;
  local_58 = "contents";
  local_2b8[0] = "contents";
  local_2a0 = sVar2;
  local_298 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_2a8;
  local_198 = strlen("contents");
  local_180 = local_2a8;
  local_178 = local_2a0;
  local_190 = local_2b8[0];
  local_1a0 = local_2b8[0];
  local_168 = local_2b8[0];
  local_170 = &local_180;
  local_421 = false;
  local_188 = local_198;
  local_160 = local_198;
  if (local_2a0 == local_198) {
    local_68 = local_2a8;
    local_70 = local_2b8[0];
    local_78 = local_198;
    if (local_198 == 0) {
      local_5c = 0;
    }
    else {
      local_5c = memcmp(local_2a8,local_2b8[0],local_198);
    }
    local_421 = local_5c == 0;
  }
  if (local_421) {
    llvm::StringRef::operator_cast_to_string(&local_2d8,(StringRef *)&this_local);
    std::__cxx11::string::operator=((string *)&this->contents,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    name_local.Length._7_1_ = true;
  }
  else {
    local_2e8 = (void *)value_local.Length;
    local_40 = local_2f8;
    local_48 = "link-output-path";
    local_2f8[0] = "link-output-path";
    local_2e0 = sVar2;
    local_1c8 = strlen("link-output-path");
    local_1b0 = local_2e8;
    local_1a8 = local_2e0;
    local_1c0 = local_2f8[0];
    local_1d0 = local_2f8[0];
    local_150 = local_2f8[0];
    local_158 = &local_1b0;
    bVar3 = false;
    local_1b8 = local_1c8;
    local_148 = local_1c8;
    if (local_2e0 == local_1c8) {
      local_88 = local_2e8;
      local_90 = local_2f8[0];
      local_98 = local_1c8;
      if (local_1c8 == 0) {
        local_7c = 0;
      }
      else {
        local_7c = memcmp(local_2e8,local_2f8[0],local_1c8);
      }
      bVar3 = local_7c == 0;
    }
    if (bVar3) {
      llvm::StringRef::operator_cast_to_string(&local_318,(StringRef *)&this_local);
      std::__cxx11::string::operator=((string *)&this->linkOutputPath,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      name_local.Length._7_1_ = true;
    }
    else {
      local_328 = (void *)value_local.Length;
      local_30 = local_338;
      local_38 = "repair-via-ownership-analysis";
      local_338[0] = "repair-via-ownership-analysis";
      local_320 = sVar2;
      local_1f8 = strlen("repair-via-ownership-analysis");
      local_1e0 = local_328;
      local_1d8 = local_320;
      local_1f0 = local_338[0];
      local_200 = local_338[0];
      local_138 = local_338[0];
      local_140 = &local_1e0;
      bVar3 = false;
      local_1e8 = local_1f8;
      local_130 = local_1f8;
      if (local_320 == local_1f8) {
        local_a8 = local_328;
        local_b0 = local_338[0];
        local_b8 = local_1f8;
        if (local_1f8 == 0) {
          local_9c = 0;
        }
        else {
          local_9c = memcmp(local_328,local_338[0],local_1f8);
        }
        bVar3 = local_9c == 0;
      }
      pCVar1 = local_298;
      if (bVar3) {
        local_348 = this_local;
        local_340 = value_local.Data;
        local_20 = local_358;
        local_28 = "true";
        local_358[0] = "true";
        local_228 = (char *)strlen("true");
        local_210 = local_348;
        local_208 = local_340;
        local_220 = local_358[0];
        local_230 = local_358[0];
        local_120 = local_358[0];
        local_128 = &local_210;
        bVar3 = false;
        local_218 = local_228;
        local_118 = local_228;
        if (local_340 == local_228) {
          local_c8 = local_348;
          local_d0 = local_358[0];
          local_d8 = local_228;
          if (local_228 == (char *)0x0) {
            local_bc = 0;
          }
          else {
            local_bc = memcmp(local_348,local_358[0],(size_t)local_228);
          }
          bVar3 = local_bc == 0;
        }
        if (bVar3) {
          (this->super_Command).repairViaOwnershipAnalysis = true;
          name_local.Length._7_1_ = true;
        }
        else {
          local_368 = this_local;
          local_360 = value_local.Data;
          local_10 = local_378;
          local_18 = "false";
          local_378[0] = "false";
          local_100 = (char *)strlen("false");
          local_240 = local_368;
          local_238 = local_360;
          local_108 = local_378[0];
          local_110 = &local_240;
          bVar3 = false;
          if (local_360 == local_100) {
            local_e8 = local_368;
            local_f0 = local_378[0];
            local_f8 = local_100;
            if (local_100 == (char *)0x0) {
              local_dc = 0;
            }
            else {
              local_dc = memcmp(local_368,local_378[0],(size_t)local_100);
            }
            bVar3 = local_dc == 0;
          }
          pCVar1 = local_298;
          if (bVar3) {
            (this->super_Command).repairViaOwnershipAnalysis = false;
            name_local.Length._7_1_ = true;
          }
          else {
            llvm::operator+(&local_3a8,"invalid value for attribute: \'",
                            (StringRef *)&value_local.Length);
            llvm::Twine::Twine(&local_3c0,"\'");
            llvm::operator+(&local_390,&local_3a8,&local_3c0);
            llbuild::buildsystem::ConfigureContext::error(pCVar1,&local_390);
            name_local.Length._7_1_ = false;
          }
        }
      }
      else {
        llvm::operator+(&local_3f0,"unexpected attribute: \'",(StringRef *)&value_local.Length);
        llvm::Twine::Twine(&local_408,"\'");
        llvm::operator+(&local_3d8,&local_3f0,&local_408);
        llbuild::buildsystem::ConfigureContext::error(pCVar1,&local_3d8);
        name_local.Length._7_1_ = false;
      }
    }
  }
  return name_local.Length._7_1_;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "contents") {
      contents = value;
      return true;
    } else if (name == "link-output-path") {
      linkOutputPath = value;
      return true;
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }